

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CppGeneratorTest_ErrorsOnBothStringTypeAndCtype_Test::TestBody
          (CppGeneratorTest_ErrorsOnBothStringTypeAndCtype_Test *this)

{
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CppGeneratorTest_ErrorsOnBothStringTypeAndCtype_Test *local_10;
  CppGeneratorTest_ErrorsOnBothStringTypeAndCtype_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2023\";\n    import \"google/protobuf/cpp_features.proto\";\n\n    message Foo {\n      int32 bar = 1;\n      bytes baz = 2 [ctype = CORD, features.(pb.cpp).string_type = VIEW];\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"Foo.baz specifies both string_type and ctype which is not supported.");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_50);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, ErrorsOnBothStringTypeAndCtype) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      int32 bar = 1;
      bytes baz = 2 [ctype = CORD, features.(pb.cpp).string_type = VIEW];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "Foo.baz specifies both string_type and ctype which is not supported.");
}